

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiWindow *pIVar1;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindowRead();
  GetColumnOffset((int)pIVar1);
  SetColumnOffset(columns._4_4_,columns._0_4_);
  return;
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}